

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicorn.c
# Opt level: O1

void m68k_release(void *ctx)

{
  long lVar1;
  undefined8 *puVar2;
  long lVar3;
  
  lVar1 = *(long *)(*(long *)((long)ctx + 0x8970) + 0x1a0);
  release_common(ctx);
  puVar2 = (undefined8 *)(lVar1 + 0x8488);
  lVar3 = 0;
  do {
    g_free((gpointer)*puVar2);
    g_free(*(gpointer *)(lVar1 + 0x8748 + lVar3));
    lVar3 = lVar3 + 0x10;
    puVar2 = puVar2 + 0x56;
  } while (lVar3 == 0x10);
  return;
}

Assistant:

static void m68k_release(void *ctx)
{
    int i;
    TCGContext *tcg_ctx = (TCGContext *)ctx;
    M68kCPU *cpu = (M68kCPU *)tcg_ctx->uc->cpu;
    CPUTLBDesc *d = cpu->neg.tlb.d;
    CPUTLBDescFast *f = cpu->neg.tlb.f;
    CPUTLBDesc *desc;
    CPUTLBDescFast *fast;

    release_common(ctx);
    for (i = 0; i < NB_MMU_MODES; i++) {
        desc = &(d[i]);
        fast = &(f[i]);
        g_free(desc->iotlb);
        g_free(fast->table);
    }
}